

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperRefs.c
# Opt level: O2

int Map_NodeIncRefPhaseAct(Map_Node_t *pNode,int fPhase)

{
  int iVar1;
  uint __line;
  char *__assertion;
  
  if (((ulong)pNode & 1) != 0) {
    __assertion = "!Map_IsComplement(pNode)";
    __line = 0x57;
LAB_00366d21:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperRefs.c"
                  ,__line,"int Map_NodeIncRefPhaseAct(Map_Node_t *, int)");
  }
  if (pNode->pCutBest[0] == (Map_Cut_t *)0x0) {
    if (pNode->pCutBest[1] == (Map_Cut_t *)0x0) {
      __assertion = "pNode->pCutBest[0] || pNode->pCutBest[1]";
      __line = 0x5a;
      goto LAB_00366d21;
    }
  }
  else if (pNode->pCutBest[1] != (Map_Cut_t *)0x0) {
    iVar1 = pNode->nRefAct[fPhase];
    pNode->nRefAct[fPhase] = iVar1 + 1;
    return iVar1;
  }
  iVar1 = pNode->nRefAct[2];
  pNode->nRefAct[2] = iVar1 + 1;
  return iVar1;
}

Assistant:

int Map_NodeIncRefPhaseAct( Map_Node_t * pNode, int fPhase )
{
    assert( !Map_IsComplement(pNode) );
    if ( pNode->pCutBest[0] && pNode->pCutBest[1] ) // both assigned
        return pNode->nRefAct[fPhase]++;
    assert( pNode->pCutBest[0] || pNode->pCutBest[1] ); // at least one assigned
    return pNode->nRefAct[2]++;
}